

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O1

void fio_json_on_string(json_parser_s *p,void *start,size_t length)

{
  json_parser_s ary;
  char cVar1;
  byte bVar2;
  json_parser_s str;
  fiobj_object_vtable_s *pfVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong *puVar7;
  long lVar8;
  ulong uVar9;
  ulong *puVar10;
  bool bVar11;
  fio_str_info_s ret;
  fio_str_info_s local_58;
  ulong *local_38;
  
  str = (json_parser_s)fiobj_str_buf(length);
  if (str == (json_parser_s)0x0) {
LAB_001604e2:
    local_58.data = anon_var_dwarf_20f;
    local_58.len._0_4_ = 4;
    goto LAB_001604f5;
  }
  if (((ulong)str & 1) != 0) {
    fio_ltocstr(&local_58,(long)str >> 1);
    goto LAB_00160595;
  }
  uVar4 = str.dict & 6;
  cVar1 = '(';
  switch(uVar4) {
  case 0:
switchD_001604a9_caseD_0:
    cVar1 = *(char *)((ulong)str & 0xfffffffffffffff8);
    break;
  case 4:
switchD_001604a9_caseD_4:
    cVar1 = '*';
    break;
  case 6:
    if ((char)str.dict == '&') {
      local_58.data = anon_var_dwarf_21a;
      local_58.len._0_4_ = 5;
    }
    else {
      uVar5 = str.dict & 0xff;
      if (uVar5 != 0x16) {
        if (uVar5 == 6) goto LAB_001604e2;
        switch(uVar4) {
        case 0:
          goto switchD_001604a9_caseD_0;
        case 4:
          goto switchD_001604a9_caseD_4;
        case 6:
          cVar1 = (char)str.dict;
        }
        break;
      }
      local_58.data = anon_var_dwarf_225;
      local_58.len._0_4_ = 4;
    }
LAB_001604f5:
    local_58.capa._0_4_ = 0;
    local_58.capa._4_4_ = 0;
    local_58.len._4_4_ = 0;
    goto LAB_00160595;
  }
  switch(cVar1) {
  case '\'':
    pfVar3 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar3 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar3 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar3 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar3 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar3 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar3->to_str)(&local_58,(FIOBJ)str);
LAB_00160595:
  puVar7 = (ulong *)local_58.data;
  if (0 < (long)length) {
    puVar10 = (ulong *)(length + (long)start);
    do {
      while ((start < (ulong *)((long)puVar10 - 7U) &&
             (uVar9 = *start ^ 0xa3a3a3a3a3a3a3a3,
             ((uVar9 & 0x7f7f7f7f7f7f7f7f) + 0x101010101010101 & uVar9 & 0x8080808080808080) == 0)))
      {
        *puVar7 = *start;
        start = (void *)((long)start + 8);
        puVar7 = puVar7 + 1;
      }
      bVar11 = start < puVar10;
      if (bVar11) {
        bVar2 = (byte)*start;
        while (bVar2 != 0x5c) {
          start = (void *)((long)start + 1);
          *(byte *)puVar7 = bVar2;
          puVar7 = (ulong *)((long)puVar7 + 1);
          bVar11 = start < puVar10;
          if (!bVar11) goto LAB_0016068f;
          bVar2 = *start;
        }
        if (!bVar11) goto LAB_0016068f;
        bVar2 = *(byte *)((long)start + 1);
        if (bVar2 < 0x62) {
          if ((bVar2 - 0x30 < 8) && ((*(byte *)((long)start + 2) & 0xf8) == 0x30)) {
            *(byte *)puVar7 = *(byte *)((long)start + 2) + bVar2 * '\b' + 0x50;
            puVar7 = (ulong *)((long)puVar7 + 1);
            start = (void *)((long)start + 3);
            goto LAB_001608be;
          }
          goto switchD_001606c1_caseD_6f;
        }
        switch(bVar2) {
        case 0x6e:
          *(byte *)puVar7 = 10;
          break;
        case 0x72:
          *(byte *)puVar7 = 0xd;
          break;
        case 0x74:
          *(byte *)puVar7 = 9;
          break;
        case 0x75:
          if ((((""[*(byte *)((long)start + 2)] == 0) || (""[*(byte *)((long)start + 3)] == 0)) ||
              (local_38 = (ulong *)local_58.data, ""[*(byte *)((long)start + 4)] == 0)) ||
             (""[*(byte *)((long)start + 5)] == 0)) goto switchD_001606c1_caseD_6f;
          uVar4 = ""[*(byte *)((long)start + 5)] - 1 |
                  (uint)""[*(byte *)((long)start + 4)] * 0x10 - 0x10 |
                  (""[*(byte *)((long)start + 3)] - 1 |
                  (uint)""[*(byte *)((long)start + 2)] * 0x10 - 0x10) << 8;
          lVar6 = 1;
          if (((*(byte *)((long)start + 6) == 0x5c) && (*(byte *)((long)start + 7) == 0x75)) &&
             ((""[(byte)*(ulong *)((long)start + 8)] != '\0' &&
              (""[*(byte *)((long)start + 9)] != 0)))) {
            if (""[*(byte *)((long)start + 10)] != 0) {
              if (""[*(byte *)((long)start + 0xb)] != 0) {
                uVar4 = (uVar4 & 0x3ff) * 0x400 +
                        ((""[*(byte *)((long)start + 0xb)] - 1 |
                          (uint)""[*(byte *)((long)start + 10)] * 0x10 + 0x3f0 |
                         (""[*(byte *)((long)start + 9)] - 1) * 0x100) & 0x3ff) + 0x10000;
                lVar6 = 7;
              }
            }
          }
          bVar2 = (byte)uVar4;
          if (uVar4 < 0x80) {
            *(byte *)puVar7 = bVar2;
            lVar8 = 1;
          }
          else if (uVar4 < 0x800) {
            *(byte *)puVar7 = (byte)(uVar4 >> 6) | 0xc0;
            *(byte *)((long)puVar7 + 1) = bVar2 & 0x3f | 0x80;
            lVar8 = 2;
          }
          else if (uVar4 < 0x10000) {
            *(byte *)puVar7 = (byte)(uVar4 >> 0xc) | 0xe0;
            *(byte *)((long)puVar7 + 1) = (byte)(uVar4 >> 6) & 0x3f | 0x80;
            *(byte *)((long)puVar7 + 2) = bVar2 & 0x3f | 0x80;
            lVar8 = 3;
          }
          else {
            *(byte *)puVar7 = (byte)(uVar4 >> 0x12) & 7 | 0xf0;
            *(byte *)((long)puVar7 + 1) = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
            *(byte *)((long)puVar7 + 2) = (byte)(uVar4 >> 6) & 0x3f | 0x80;
            *(byte *)((long)puVar7 + 3) = bVar2 & 0x3f | 0x80;
            lVar8 = 4;
          }
          puVar7 = (ulong *)((long)puVar7 + lVar8);
          start = (void *)((long)start + lVar6 + 5);
          goto LAB_001608be;
        case 0x78:
          if ((""[*(byte *)((long)start + 2)] != '\0') && (""[*(byte *)((long)start + 3)] != '\0'))
          {
            *(byte *)puVar7 =
                 ""[*(byte *)((long)start + 3)] - 1 | ""[*(byte *)((long)start + 2)] * '\x10' - 0x10
            ;
            puVar7 = (ulong *)((long)puVar7 + 1);
            start = (void *)((long)start + 4);
            goto LAB_001608be;
          }
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
        case 0x76:
        case 0x77:
switchD_001606c1_caseD_6f:
          *(byte *)puVar7 = bVar2;
          break;
        default:
          if (bVar2 == 0x66) {
            *(byte *)puVar7 = 0xc;
          }
          else {
            if (bVar2 != 0x62) goto switchD_001606c1_caseD_6f;
            *(byte *)puVar7 = 8;
          }
        }
        start = (void *)((long)start + 2);
        puVar7 = (ulong *)((long)puVar7 + 1);
LAB_001608be:
        bVar11 = true;
      }
      else {
LAB_0016068f:
        bVar11 = false;
      }
    } while ((bVar11) && (start < puVar10));
  }
  fiobj_str_resize((FIOBJ)str,(long)puVar7 - (long)local_58.data);
  ary = p[2];
  if (ary == (json_parser_s)0x0) {
    p[2] = str;
  }
  else if ((char)p[8].dict == '\0') {
    fiobj_ary_push((FIOBJ)ary,(FIOBJ)str);
  }
  else if (p[1] == (json_parser_s)0x0) {
    p[1] = str;
  }
  else {
    fiobj_hash_set((FIOBJ)ary,(FIOBJ)p[1],(FIOBJ)str);
    fiobj_free((FIOBJ)p[1]);
    p[1].dict = 0;
    p[1].depth = '\0';
    p[1].key = '\0';
    *(undefined2 *)&p[1].field_0x6 = 0;
  }
  return;
}

Assistant:

static void fio_json_on_string(json_parser_s *p, void *start, size_t length) {
  FIOBJ str = fiobj_str_buf(length);
  fiobj_str_resize(
      str, fio_json_unescape_str(fiobj_obj2cstr(str).data, start, length));
  fiobj_json_add2parser((fiobj_json_parser_s *)p, str);
}